

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

void __thiscall rpc_tests::check_dup_param_names::test_method(check_dup_param_names *this)

{
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar2;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar3;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar4;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar5;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar6;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar7;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar9;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar10;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar11;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar12;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar13;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar14;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar15;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar16;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar17;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar18;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  vVar19;
  allocator_type *in_RCX;
  allocator_type *paVar20;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  size_type extraout_RDX_06;
  size_type extraout_RDX_07;
  size_type extraout_RDX_08;
  size_type extraout_RDX_09;
  size_type extraout_RDX_10;
  size_type extraout_RDX_11;
  size_type extraout_RDX_12;
  size_type extraout_RDX_13;
  size_type extraout_RDX_14;
  size_type extraout_RDX_15;
  size_type extraout_RDX_16;
  size_type extraout_RDX_17;
  long lVar21;
  iterator in_R8;
  iterator pvVar22;
  iterator in_R9;
  iterator pvVar23;
  long *plVar24;
  long in_FS_OFFSET;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_00;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_01;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_02;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_03;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_04;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_05;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_06;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_07;
  const_string file;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_08;
  const_string file_00;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_09;
  const_string file_01;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_10;
  const_string file_02;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_11;
  const_string file_03;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_12;
  const_string file_04;
  const_string file_05;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_13;
  const_string file_06;
  const_string file_07;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_14;
  const_string file_08;
  const_string file_09;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_15;
  const_string file_10;
  const_string file_11;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_16;
  const_string file_12;
  const_string file_13;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>
  __l_17;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  undefined4 in_stack_ffffffffffffebd8;
  undefined4 uVar25;
  undefined4 in_stack_ffffffffffffebdc;
  undefined4 uVar26;
  check_type cVar27;
  pointer in_stack_ffffffffffffebe8;
  char *local_13e0;
  char *local_13d8;
  undefined1 *local_13d0;
  undefined1 *local_13c8;
  char *local_13c0;
  char *local_13b8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_13b0;
  undefined1 *local_1398;
  undefined1 *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1348;
  char *local_1340;
  undefined1 *local_1338;
  undefined1 *local_1330;
  char *local_1328;
  char *local_1320;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1318;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12b0;
  char *local_12a8;
  undefined1 *local_12a0;
  undefined1 *local_1298;
  char *local_1290;
  char *local_1288;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1280;
  undefined1 *local_1268;
  undefined1 *local_1260;
  char *local_1258;
  char *local_1250;
  char *local_1218;
  char *local_1210;
  undefined1 *local_1208;
  undefined1 *local_1200;
  char *local_11f8;
  char *local_11f0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_11e8;
  undefined1 *local_11d0;
  undefined1 *local_11c8;
  char *local_11c0;
  char *local_11b8;
  char *local_1180;
  char *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  char *local_1160;
  char *local_1158;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1150;
  undefined1 *local_1138;
  undefined1 *local_1130;
  char *local_1128;
  char *local_1120;
  char *local_10e8;
  char *local_10e0;
  undefined1 *local_10d8;
  undefined1 *local_10d0;
  char *local_10c8;
  char *local_10c0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_10b8;
  undefined1 *local_10a0;
  undefined1 *local_1098;
  char *local_1090;
  char *local_1088;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1080 [3];
  char *local_1038;
  char *local_1030;
  undefined1 *local_1028;
  undefined1 *local_1020;
  char *local_1018;
  char *local_1010;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_1008;
  undefined1 *local_ff0;
  undefined1 *local_fe8;
  char *local_fe0;
  char *local_fd8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_fd0 [3];
  char *local_f88;
  char *local_f80;
  assertion_result local_f78;
  undefined1 *local_f60;
  undefined1 *local_f58;
  char *local_f50;
  char *local_f48;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_f40;
  undefined1 *local_f28;
  undefined1 *local_f20;
  char *local_f18;
  char *local_f10;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_f08;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ef0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ed8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ec0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_ea8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e90;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e78;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e60;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  local_e48;
  RPCHelpMan local_e30;
  RPCHelpMan local_d78;
  RPCHelpMan local_cc0;
  RPCHelpMan local_c08;
  RPCHelpMan local_b50;
  RPCHelpMan local_a98;
  RPCHelpMan local_9e0;
  RPCHelpMan local_928;
  RPCHelpMan local_870;
  RPCHelpMan local_7b8;
  RPCHelpMan local_700;
  RPCHelpMan local_648;
  RPCHelpMan local_590;
  RPCHelpMan local_4d8;
  RPCHelpMan local_420;
  RPCHelpMan local_368;
  RPCHelpMan local_2b0;
  RPCHelpMan local_1f8;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  undefined1 *local_130;
  char *local_128 [2];
  undefined4 local_118;
  long *local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined2 local_fc;
  RPCHelpMan local_f0;
  long local_38;
  
  local_1030 = (char *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 0;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l._M_len = extraout_RDX;
  __l._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e48,__l,in_RCX);
  vVar1.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar1.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar1.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar1.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_f0,
             (anon_class_1_0_00000001 *)
             local_e48.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_examples.m_examples._M_dataplus._M_p != &local_f0.m_examples.m_examples.field_2)
  {
    operator_delete(local_f0.m_examples.m_examples._M_dataplus._M_p,
                    local_f0.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f0.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_f0.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_description._M_dataplus._M_p != &local_f0.m_description.field_2) {
    operator_delete(local_f0.m_description._M_dataplus._M_p,
                    local_f0.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_f0.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f0.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_f0.m_fun,(_Any_data *)&local_f0.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_name._M_dataplus._M_p != &local_f0.m_name.field_2) {
    operator_delete(local_f0.m_name._M_dataplus._M_p,
                    local_f0.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e48);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 1;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_00._M_len = extraout_RDX_00;
  __l_00._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e60,__l_00,in_RCX);
  vVar2.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar2.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar2.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar2.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_1f8,
             (anon_class_1_0_00000001 *)
             local_e60.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_examples.m_examples._M_dataplus._M_p !=
      &local_1f8.m_examples.m_examples.field_2) {
    operator_delete(local_1f8.m_examples.m_examples._M_dataplus._M_p,
                    local_1f8.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1f8.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1f8.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_description._M_dataplus._M_p != &local_1f8.m_description.field_2) {
    operator_delete(local_1f8.m_description._M_dataplus._M_p,
                    local_1f8.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1f8.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_1f8.m_fun,(_Any_data *)&local_1f8.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
    operator_delete(local_1f8.m_name._M_dataplus._M_p,
                    local_1f8.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e60);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 2;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_01._M_len = extraout_RDX_01;
  __l_01._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e78,__l_01,in_RCX);
  vVar3.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar3.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar3.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar3.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_2b0,
             (anon_class_1_0_00000001 *)
             local_e78.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.m_examples.m_examples._M_dataplus._M_p !=
      &local_2b0.m_examples.m_examples.field_2) {
    operator_delete(local_2b0.m_examples.m_examples._M_dataplus._M_p,
                    local_2b0.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b0.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_2b0.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.m_description._M_dataplus._M_p != &local_2b0.m_description.field_2) {
    operator_delete(local_2b0.m_description._M_dataplus._M_p,
                    local_2b0.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2b0.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_2b0.m_fun,(_Any_data *)&local_2b0.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.m_name._M_dataplus._M_p != &local_2b0.m_name.field_2) {
    operator_delete(local_2b0.m_name._M_dataplus._M_p,
                    local_2b0.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e78);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 0;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_02._M_len = extraout_RDX_02;
  __l_02._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_e90,__l_02,in_RCX);
  vVar4.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar4.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar4.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar4.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_368,
             (anon_class_1_0_00000001 *)
             local_e90.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_examples.m_examples._M_dataplus._M_p !=
      &local_368.m_examples.m_examples.field_2) {
    operator_delete(local_368.m_examples.m_examples._M_dataplus._M_p,
                    local_368.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_368.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_368.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_description._M_dataplus._M_p != &local_368.m_description.field_2) {
    operator_delete(local_368.m_description._M_dataplus._M_p,
                    local_368.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_368.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_368.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_368.m_fun,(_Any_data *)&local_368.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
    operator_delete(local_368.m_name._M_dataplus._M_p,
                    local_368.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_e90);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 1;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_03._M_len = extraout_RDX_03;
  __l_03._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ea8,__l_03,in_RCX);
  vVar5.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar5.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar5.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar5.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_420,
             (anon_class_1_0_00000001 *)
             local_ea8.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.m_examples.m_examples._M_dataplus._M_p !=
      &local_420.m_examples.m_examples.field_2) {
    operator_delete(local_420.m_examples.m_examples._M_dataplus._M_p,
                    local_420.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_420.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_420.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.m_description._M_dataplus._M_p != &local_420.m_description.field_2) {
    operator_delete(local_420.m_description._M_dataplus._M_p,
                    local_420.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_420.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_420.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_420.m_fun,(_Any_data *)&local_420.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.m_name._M_dataplus._M_p != &local_420.m_name.field_2) {
    operator_delete(local_420.m_name._M_dataplus._M_p,
                    local_420.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ea8);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 2;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_04._M_len = extraout_RDX_04;
  __l_04._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ec0,__l_04,in_RCX);
  vVar6.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar6.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar6.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar6.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_4d8,
             (anon_class_1_0_00000001 *)
             local_ec0.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8.m_examples.m_examples._M_dataplus._M_p !=
      &local_4d8.m_examples.m_examples.field_2) {
    operator_delete(local_4d8.m_examples.m_examples._M_dataplus._M_p,
                    local_4d8.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_4d8.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_4d8.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8.m_description._M_dataplus._M_p != &local_4d8.m_description.field_2) {
    operator_delete(local_4d8.m_description._M_dataplus._M_p,
                    local_4d8.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_4d8.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d8.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_4d8.m_fun,(_Any_data *)&local_4d8.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8.m_name._M_dataplus._M_p != &local_4d8.m_name.field_2) {
    operator_delete(local_4d8.m_name._M_dataplus._M_p,
                    local_4d8.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ec0);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 0;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_05._M_len = extraout_RDX_05;
  __l_05._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ed8,__l_05,in_RCX);
  vVar7.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar7.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar7.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar7.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_590,
             (anon_class_1_0_00000001 *)
             local_ed8.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590.m_examples.m_examples._M_dataplus._M_p !=
      &local_590.m_examples.m_examples.field_2) {
    operator_delete(local_590.m_examples.m_examples._M_dataplus._M_p,
                    local_590.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_590.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_590.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590.m_description._M_dataplus._M_p != &local_590.m_description.field_2) {
    operator_delete(local_590.m_description._M_dataplus._M_p,
                    local_590.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_590.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_590.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_590.m_fun,(_Any_data *)&local_590.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590.m_name._M_dataplus._M_p != &local_590.m_name.field_2) {
    operator_delete(local_590.m_name._M_dataplus._M_p,
                    local_590.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ed8);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 1;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_06._M_len = extraout_RDX_06;
  __l_06._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_ef0,__l_06,in_RCX);
  vVar8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_648,
             (anon_class_1_0_00000001 *)
             local_ef0.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648.m_examples.m_examples._M_dataplus._M_p !=
      &local_648.m_examples.m_examples.field_2) {
    operator_delete(local_648.m_examples.m_examples._M_dataplus._M_p,
                    local_648.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_648.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_648.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648.m_description._M_dataplus._M_p != &local_648.m_description.field_2) {
    operator_delete(local_648.m_description._M_dataplus._M_p,
                    local_648.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_648.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_648.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_648.m_fun,(_Any_data *)&local_648.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648.m_name._M_dataplus._M_p != &local_648.m_name.field_2) {
    operator_delete(local_648.m_name._M_dataplus._M_p,
                    local_648.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_ef0);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_140._0_4_ = 2;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 2;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p2","");
  __l_07._M_len = extraout_RDX_07;
  __l_07._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_f08,__l_07,in_RCX);
  vVar9.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar9.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar9.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar9.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_700,
             (anon_class_1_0_00000001 *)
             local_f08.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700.m_examples.m_examples._M_dataplus._M_p !=
      &local_700.m_examples.m_examples.field_2) {
    operator_delete(local_700.m_examples.m_examples._M_dataplus._M_p,
                    local_700.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_700.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_700.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700.m_description._M_dataplus._M_p != &local_700.m_description.field_2) {
    operator_delete(local_700.m_description._M_dataplus._M_p,
                    local_700.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_700.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_700.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_700.m_fun,(_Any_data *)&local_700.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700.m_name._M_dataplus._M_p != &local_700.m_name.field_2) {
    operator_delete(local_700.m_name._M_dataplus._M_p,
                    local_700.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_f08);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_f18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f10 = "";
  paVar20 = (allocator_type *)&local_f28;
  local_f28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x21a;
  file.m_begin = (iterator)&local_f18;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)paVar20,msg);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 0;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_08._M_len = extraout_RDX_08;
  __l_08._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_f40,__l_08,paVar20);
  vVar10.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffebdc;
  vVar10.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_ffffffffffffebd8;
  vVar10.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar10.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_7b8,
             (anon_class_1_0_00000001 *)
             local_f40.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_examples.m_examples._M_dataplus._M_p !=
      &local_7b8.m_examples.m_examples.field_2) {
    operator_delete(local_7b8.m_examples.m_examples._M_dataplus._M_p,
                    local_7b8.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7b8.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_7b8.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_description._M_dataplus._M_p != &local_7b8.m_description.field_2) {
    operator_delete(local_7b8.m_description._M_dataplus._M_p,
                    local_7b8.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_7b8.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7b8.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_7b8.m_fun,(_Any_data *)&local_7b8.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8.m_name._M_dataplus._M_p != &local_7b8.m_name.field_2) {
    operator_delete(local_7b8.m_name._M_dataplus._M_p,
                    local_7b8.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_f40);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_f50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f48 = "";
  local_f60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x21a;
  file_00.m_begin = (iterator)&local_f50;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f60,
             msg_00);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_f88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f80 = "";
  uVar25 = 0;
  uVar26 = 0;
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x1;
  paVar20 = (allocator_type *)0x21a;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_f88,0x21a);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 1;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_09._M_len = extraout_RDX_09;
  __l_09._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(local_fd0,__l_09,paVar20);
  vVar11.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar11.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar11.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar11.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_870,
             (anon_class_1_0_00000001 *)
             local_fd0[0].
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.m_examples.m_examples._M_dataplus._M_p !=
      &local_870.m_examples.m_examples.field_2) {
    operator_delete(local_870.m_examples.m_examples._M_dataplus._M_p,
                    local_870.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_870.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_870.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.m_description._M_dataplus._M_p != &local_870.m_description.field_2) {
    operator_delete(local_870.m_description._M_dataplus._M_p,
                    local_870.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_870.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_870.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_870.m_fun,(_Any_data *)&local_870.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.m_name._M_dataplus._M_p != &local_870.m_name.field_2) {
    operator_delete(local_870.m_name._M_dataplus._M_p,
                    local_870.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(local_fd0);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_fe0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fd8 = "";
  paVar20 = (allocator_type *)&local_ff0;
  local_ff0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fe8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x21c;
  file_01.m_begin = (iterator)&local_fe0;
  msg_01.m_end = pvVar23;
  msg_01.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)paVar20,msg_01);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 2;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_10._M_len = extraout_RDX_10;
  __l_10._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1008,__l_10,paVar20);
  vVar12.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar12.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar12.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar12.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_928,
             (anon_class_1_0_00000001 *)
             local_1008.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_examples.m_examples._M_dataplus._M_p !=
      &local_928.m_examples.m_examples.field_2) {
    operator_delete(local_928.m_examples.m_examples._M_dataplus._M_p,
                    local_928.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_928.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_928.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_description._M_dataplus._M_p != &local_928.m_description.field_2) {
    operator_delete(local_928.m_description._M_dataplus._M_p,
                    local_928.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_928.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_928.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_928.m_fun,(_Any_data *)&local_928.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_name._M_dataplus._M_p != &local_928.m_name.field_2) {
    operator_delete(local_928.m_name._M_dataplus._M_p,
                    local_928.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1008);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_1018 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1010 = "";
  local_1028 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1020 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x21c;
  file_02.m_begin = (iterator)&local_1018;
  msg_02.m_end = pvVar23;
  msg_02.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1028,
             msg_02);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_1038 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1030 = "";
  uVar25 = 0;
  uVar26 = 0;
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x1;
  paVar20 = (allocator_type *)0x21c;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_1038,0x21c);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 0;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_11._M_len = extraout_RDX_11;
  __l_11._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(local_1080,__l_11,paVar20);
  vVar13.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar13.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar13.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar13.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_9e0,
             (anon_class_1_0_00000001 *)
             local_1080[0].
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0.m_examples.m_examples._M_dataplus._M_p !=
      &local_9e0.m_examples.m_examples.field_2) {
    operator_delete(local_9e0.m_examples.m_examples._M_dataplus._M_p,
                    local_9e0.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_9e0.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_9e0.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0.m_description._M_dataplus._M_p != &local_9e0.m_description.field_2) {
    operator_delete(local_9e0.m_description._M_dataplus._M_p,
                    local_9e0.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_9e0.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_9e0.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_9e0.m_fun,(_Any_data *)&local_9e0.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0.m_name._M_dataplus._M_p != &local_9e0.m_name.field_2) {
    operator_delete(local_9e0.m_name._M_dataplus._M_p,
                    local_9e0.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(local_1080);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_1090 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1088 = "";
  paVar20 = (allocator_type *)&local_10a0;
  local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x21e;
  file_03.m_begin = (iterator)&local_1090;
  msg_03.m_end = pvVar23;
  msg_03.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)paVar20,msg_03);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 1;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_12._M_len = extraout_RDX_12;
  __l_12._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_10b8,__l_12,paVar20);
  vVar14.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar14.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar14.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar14.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_a98,
             (anon_class_1_0_00000001 *)
             local_10b8.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98.m_examples.m_examples._M_dataplus._M_p !=
      &local_a98.m_examples.m_examples.field_2) {
    operator_delete(local_a98.m_examples.m_examples._M_dataplus._M_p,
                    local_a98.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a98.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a98.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98.m_description._M_dataplus._M_p != &local_a98.m_description.field_2) {
    operator_delete(local_a98.m_description._M_dataplus._M_p,
                    local_a98.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_a98.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a98.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_a98.m_fun,(_Any_data *)&local_a98.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98.m_name._M_dataplus._M_p != &local_a98.m_name.field_2) {
    operator_delete(local_a98.m_name._M_dataplus._M_p,
                    local_a98.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_10b8);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_10c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10c0 = "";
  local_10d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x21e;
  file_04.m_begin = (iterator)&local_10c8;
  msg_04.m_end = pvVar23;
  msg_04.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_10d8,
             msg_04);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_10e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10e0 = "";
  uVar25 = 0;
  uVar26 = 0;
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_10e8,0x21e);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_1128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1120 = "";
  paVar20 = (allocator_type *)&local_1138;
  local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x21f;
  file_05.m_begin = (iterator)&local_1128;
  msg_05.m_end = pvVar23;
  msg_05.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)paVar20,msg_05);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x1;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 2;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_13._M_len = extraout_RDX_13;
  __l_13._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1150,__l_13,paVar20);
  vVar15.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar15.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar15.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar15.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_b50,
             (anon_class_1_0_00000001 *)
             local_1150.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50.m_examples.m_examples._M_dataplus._M_p !=
      &local_b50.m_examples.m_examples.field_2) {
    operator_delete(local_b50.m_examples.m_examples._M_dataplus._M_p,
                    local_b50.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b50.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_b50.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50.m_description._M_dataplus._M_p != &local_b50.m_description.field_2) {
    operator_delete(local_b50.m_description._M_dataplus._M_p,
                    local_b50.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_b50.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b50.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_b50.m_fun,(_Any_data *)&local_b50.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50.m_name._M_dataplus._M_p != &local_b50.m_name.field_2) {
    operator_delete(local_b50.m_name._M_dataplus._M_p,
                    local_b50.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1150);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_1160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1158 = "";
  local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x21f;
  file_06.m_begin = (iterator)&local_1160;
  msg_06.m_end = pvVar23;
  msg_06.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1170,
             msg_06);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_1180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1178 = "";
  uVar25 = 0;
  uVar26 = 0;
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_1180,0x21f);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_11c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11b8 = "";
  paVar20 = (allocator_type *)&local_11d0;
  local_11d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x220;
  file_07.m_begin = (iterator)&local_11c0;
  msg_07.m_end = pvVar23;
  msg_07.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)paVar20,msg_07);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 0;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_14._M_len = extraout_RDX_14;
  __l_14._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_11e8,__l_14,paVar20);
  vVar16.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar16.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar16.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar16.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_c08,
             (anon_class_1_0_00000001 *)
             local_11e8.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08.m_examples.m_examples._M_dataplus._M_p !=
      &local_c08.m_examples.m_examples.field_2) {
    operator_delete(local_c08.m_examples.m_examples._M_dataplus._M_p,
                    local_c08.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c08.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_c08.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08.m_description._M_dataplus._M_p != &local_c08.m_description.field_2) {
    operator_delete(local_c08.m_description._M_dataplus._M_p,
                    local_c08.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_c08.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c08.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_c08.m_fun,(_Any_data *)&local_c08.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08.m_name._M_dataplus._M_p != &local_c08.m_name.field_2) {
    operator_delete(local_c08.m_name._M_dataplus._M_p,
                    local_c08.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_11e8);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_11f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11f0 = "";
  local_1208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x220;
  file_08.m_begin = (iterator)&local_11f8;
  msg_08.m_end = pvVar23;
  msg_08.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_1208,
             msg_08);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_1218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1210 = "";
  uVar25 = 0;
  uVar26 = 0;
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_1218,0x220);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_1258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1250 = "";
  paVar20 = (allocator_type *)&local_1268;
  local_1268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x221;
  file_09.m_begin = (iterator)&local_1258;
  msg_09.m_end = pvVar23;
  msg_09.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)paVar20,msg_09);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 1;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_15._M_len = extraout_RDX_15;
  __l_15._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1280,__l_15,paVar20);
  vVar17.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar17.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar17.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar17.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_cc0,
             (anon_class_1_0_00000001 *)
             local_1280.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc0.m_examples.m_examples._M_dataplus._M_p !=
      &local_cc0.m_examples.m_examples.field_2) {
    operator_delete(local_cc0.m_examples.m_examples._M_dataplus._M_p,
                    local_cc0.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cc0.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_cc0.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc0.m_description._M_dataplus._M_p != &local_cc0.m_description.field_2) {
    operator_delete(local_cc0.m_description._M_dataplus._M_p,
                    local_cc0.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_cc0.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_cc0.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_cc0.m_fun,(_Any_data *)&local_cc0.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc0.m_name._M_dataplus._M_p != &local_cc0.m_name.field_2) {
    operator_delete(local_cc0.m_name._M_dataplus._M_p,
                    local_cc0.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1280);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_1290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1288 = "";
  local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x221;
  file_10.m_begin = (iterator)&local_1290;
  msg_10.m_end = pvVar23;
  msg_10.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_12a0,
             msg_10);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_12b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12a8 = "";
  uVar25 = 0;
  uVar26 = 0;
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_12b0,0x221);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_12f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12e8 = "";
  paVar20 = (allocator_type *)&local_1300;
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x222;
  file_11.m_begin = (iterator)&local_12f0;
  msg_11.m_end = pvVar23;
  msg_11.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)paVar20,msg_11);
  local_140._0_4_ = (_Head_base<1UL,_ParamType,_false>)0x2;
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  local_118 = 2;
  plVar24 = (long *)&local_100;
  local_110 = plVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p1","");
  __l_16._M_len = extraout_RDX_16;
  __l_16._M_array = (iterator)local_140;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_1318,__l_16,paVar20);
  vVar18.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar18.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar18.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar18.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_d78,
             (anon_class_1_0_00000001 *)
             local_1318.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78.m_examples.m_examples._M_dataplus._M_p !=
      &local_d78.m_examples.m_examples.field_2) {
    operator_delete(local_d78.m_examples.m_examples._M_dataplus._M_p,
                    local_d78.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d78.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_d78.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78.m_description._M_dataplus._M_p != &local_d78.m_description.field_2) {
    operator_delete(local_d78.m_description._M_dataplus._M_p,
                    local_d78.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_d78.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d78.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_d78.m_fun,(_Any_data *)&local_d78.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78.m_name._M_dataplus._M_p != &local_d78.m_name.field_2) {
    operator_delete(local_d78.m_name._M_dataplus._M_p,
                    local_d78.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_1318);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_1328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1320 = "";
  local_1338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x222;
  file_12.m_begin = (iterator)&local_1328;
  msg_12.m_end = pvVar23;
  msg_12.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_1338,
             msg_12);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_1348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1340 = "";
  uVar25 = 0;
  uVar26 = 0;
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_1348,0x222);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  local_1388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1380 = "";
  paVar20 = (allocator_type *)&local_1398;
  local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x225;
  file_13.m_begin = (iterator)&local_1388;
  msg_13.m_end = pvVar23;
  msg_13.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)paVar20,msg_13);
  local_140 = (undefined1  [8])((ulong)local_140 & 0xffffffff00000000);
  local_138._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"p1","");
  plVar24 = (long *)&local_100;
  local_118 = 2;
  local_100 = 0x707c3270;
  local_fc = 0x31;
  local_108 = 5;
  __l_17._M_len = extraout_RDX_17;
  __l_17._M_array = (iterator)local_140;
  local_110 = plVar24;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::vector(&local_13b0,__l_17,paVar20);
  vVar19.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar26;
  vVar19.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar25;
  vVar19.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_cVar27;
  vVar19.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffebe8;
  test_method::anon_class_1_0_00000001::operator()
            (&local_e30,
             (anon_class_1_0_00000001 *)
             local_13b0.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
             ._M_impl.super__Vector_impl_data._M_start,vVar19);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30.m_examples.m_examples._M_dataplus._M_p !=
      &local_e30.m_examples.m_examples.field_2) {
    operator_delete(local_e30.m_examples.m_examples._M_dataplus._M_p,
                    local_e30.m_examples.m_examples.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e30.m_results.m_results);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_e30.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30.m_description._M_dataplus._M_p != &local_e30.m_description.field_2) {
    operator_delete(local_e30.m_description._M_dataplus._M_p,
                    local_e30.m_description.field_2._M_allocated_capacity + 1);
  }
  if (local_e30.m_fun.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e30.m_fun.super__Function_base._M_manager)
              ((_Any_data *)&local_e30.m_fun,(_Any_data *)&local_e30.m_fun,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30.m_name._M_dataplus._M_p != &local_e30.m_name.field_2) {
    operator_delete(local_e30.m_name._M_dataplus._M_p,
                    local_e30.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParamType>_>_>
  ::~vector(&local_13b0);
  lVar21 = -0x50;
  do {
    if (plVar24 != (long *)plVar24[-2]) {
      operator_delete((long *)plVar24[-2],*plVar24 + 1);
    }
    plVar24 = plVar24 + -5;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0);
  local_13c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13b8 = "";
  local_13d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x225;
  file_14.m_begin = (iterator)&local_13c0;
  msg_14.m_end = pvVar23;
  msg_14.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_13d0,
             msg_14);
  local_f78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_f78.m_message.px = (element_type *)0x0;
  local_f78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_138._M_p = local_138._M_p & 0xffffffffffffff00;
  local_140 = (undefined1  [8])&PTR__lazy_ostream_013ae9d8;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128[0] = "exception NonFatalCheckError expected but not raised";
  local_13e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13d8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_f78,(lazy_ostream *)local_140,1,1,WARN,_cVar27,(size_t)&local_13e0,0x225);
  boost::detail::shared_count::~shared_count(&local_f78.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_dup_param_names)
{
    enum ParamType { POSITIONAL, NAMED, NAMED_ONLY };
    auto make_rpc = [](std::vector<std::tuple<std::string, ParamType>> param_names) {
        std::vector<RPCArg> params;
        std::vector<RPCArg> options;
        auto push_options = [&] { if (!options.empty()) params.emplace_back(strprintf("options%i", params.size()), RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "", std::move(options)); };
        for (auto& [param_name, param_type] : param_names) {
            if (param_type == POSITIONAL) {
                push_options();
                params.emplace_back(std::move(param_name), RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "description");
            } else {
                options.emplace_back(std::move(param_name), RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "description", RPCArgOptions{.also_positional = param_type == NAMED});
            }
        }
        push_options();
        return RPCHelpMan{"method_name", "description", params, RPCResults{}, RPCExamples{""}};
    };

    // No errors if parameter names are unique.
    make_rpc({{"p1", POSITIONAL}, {"p2", POSITIONAL}});
    make_rpc({{"p1", POSITIONAL}, {"p2", NAMED}});
    make_rpc({{"p1", POSITIONAL}, {"p2", NAMED_ONLY}});
    make_rpc({{"p1", NAMED}, {"p2", POSITIONAL}});
    make_rpc({{"p1", NAMED}, {"p2", NAMED}});
    make_rpc({{"p1", NAMED}, {"p2", NAMED_ONLY}});
    make_rpc({{"p1", NAMED_ONLY}, {"p2", POSITIONAL}});
    make_rpc({{"p1", NAMED_ONLY}, {"p2", NAMED}});
    make_rpc({{"p1", NAMED_ONLY}, {"p2", NAMED_ONLY}});

    // Error if parameters names are duplicates, unless one parameter is
    // positional and the other is named and .also_positional is true.
    BOOST_CHECK_THROW(make_rpc({{"p1", POSITIONAL}, {"p1", POSITIONAL}}), NonFatalCheckError);
    make_rpc({{"p1", POSITIONAL}, {"p1", NAMED}});
    BOOST_CHECK_THROW(make_rpc({{"p1", POSITIONAL}, {"p1", NAMED_ONLY}}), NonFatalCheckError);
    make_rpc({{"p1", NAMED}, {"p1", POSITIONAL}});
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED}, {"p1", NAMED}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED}, {"p1", NAMED_ONLY}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED_ONLY}, {"p1", POSITIONAL}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED_ONLY}, {"p1", NAMED}}), NonFatalCheckError);
    BOOST_CHECK_THROW(make_rpc({{"p1", NAMED_ONLY}, {"p1", NAMED_ONLY}}), NonFatalCheckError);

    // Make sure duplicate aliases are detected too.
    BOOST_CHECK_THROW(make_rpc({{"p1", POSITIONAL}, {"p2|p1", NAMED_ONLY}}), NonFatalCheckError);
}